

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::locate_sos_marker(jpeg_decoder *this)

{
  int iVar1;
  jpeg_decoder *in_RDI;
  int c;
  jpgd_status in_stack_ffffffffffffffdc;
  jpeg_decoder *this_00;
  undefined4 local_4;
  
  this_00 = in_RDI;
  iVar1 = process_markers(in_RDI);
  if (iVar1 == 0xd9) {
    local_4 = 0;
  }
  else {
    if (iVar1 != 0xda) {
      stop_decoding(in_RDI,in_stack_ffffffffffffffdc);
    }
    read_sos_marker(this_00);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int jpeg_decoder::locate_sos_marker()
	{
		int c;

		c = process_markers();

		if (c == M_EOI)
			return JPGD_FALSE;
		else if (c != M_SOS)
			stop_decoding(JPGD_UNEXPECTED_MARKER);

		read_sos_marker();

		return JPGD_TRUE;
	}